

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::findxtname(Forth *this)

{
  uint index;
  Cell index_00;
  Definition *pDVar1;
  ulong uVar2;
  string wordBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  requireDStackDepth(this,1,"FIND-XT-NAME");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_60,0x10,' ');
  index = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  index_00 = dataSpaceAtCell(this,index);
  if ((index_00 == 0) ||
     (uVar2 = ((long)(this->definitions).
                     super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->definitions).
                     super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333,
     uVar2 < index_00 || uVar2 - index_00 == 0)) {
    index_00 = 0;
  }
  if (index_00 != 0) {
    pDVar1 = definitionsAt(this,index_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_60,&pDVar1->name);
  }
  if (local_60._M_string_length < 0x10) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_40,0x10 - local_60._M_string_length,' ');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_60,local_40._M_dataplus._M_p,local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->writeToTarget == ToStdCout) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::ostream::flush();
  }
  else if (this->writeToTarget == ToString) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->field_0x20,local_60._M_dataplus._M_p,local_60._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void  findxtname() {
			REQUIRE_DSTACK_DEPTH(1, "FIND-XT-NAME");
			std::string wordBuffer(16,' ');
			auto address = dStack.getTop(); pop();
			auto xt=CELL(getDataCell(address));
			auto xtfound=findXt(xt);
			//std::cout << std::endl << address << " "<< xt << " " << xtfound << std::endl;
			if(xtfound>0){
				wordBuffer=definitionsAt(xtfound).name;	
				//std::cerr << " more " << wordBuffer;
			} 
			if(wordBuffer.size()<16) {
			 wordBuffer.append(std::string(16-wordBuffer.size(), ' '));
			}

#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << wordBuffer  ;
				break;
			case ToStdCout:
				std::cout << wordBuffer ;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}